

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

void __thiscall CTcTokenizer::pragma_message(CTcTokenizer *this)

{
  CTcToken *tok;
  utf8_ptr *p;
  char *pcVar1;
  size_t __n;
  int iVar2;
  tc_toktyp_t tVar3;
  char *__n_00;
  
  pcVar1 = (this->linebuf_).buf_;
  __n_00 = (this->curtok_).text_ + ((this->curtok_).text_len_ - (long)pcVar1);
  (*(this->expbuf_)._vptr_CTcTokString[2])(&this->expbuf_,__n_00);
  memcpy((this->expbuf_).buf_,pcVar1,(size_t)__n_00);
  (this->expbuf_).buf_len_ = (size_t)__n_00;
  (this->expbuf_).buf_[(long)__n_00] = '\0';
  iVar2 = expand_macros_curline(this,0,0,1);
  if (iVar2 == 0) {
    if ((undefined1  [3440])((undefined1  [3440])*this & (undefined1  [3440])0x14) !=
        (undefined1  [3440])0x0) {
      pcVar1 = (this->expbuf_).buf_;
      __n = (this->expbuf_).buf_len_;
      (*(this->linebuf_)._vptr_CTcTokString[2])(&this->linebuf_,__n);
      memcpy((this->linebuf_).buf_,pcVar1,__n);
      (this->linebuf_).buf_len_ = __n;
      (this->linebuf_).buf_[__n] = '\0';
      return;
    }
    tok = &this->curtok_;
    this->curbuf_ = &this->expbuf_;
    p = &this->p_;
    (this->p_).p_ = (this->expbuf_).buf_ + (int)__n_00;
    tVar3 = next_on_line_xlat(this,p,tok,(tok_embed_ctx *)0x0);
    if (tVar3 == TOKT_LPAR) {
      next_on_line_xlat(this,p,tok,(tok_embed_ctx *)0x0);
    }
    else {
      log_warning(0x271f);
    }
    do {
      tVar3 = tok->typ_;
      switch(tVar3) {
      case TOKT_SYM:
      case TOKT_SSTR:
      case TOKT_DSTR:
        CTcHostIfc::print_msg(G_hostifc,"%.*s",(ulong)(uint)(this->curtok_).text_len_);
        break;
      case TOKT_INT:
        CTcHostIfc::print_msg(G_hostifc,"%ld",(this->curtok_).int_val_);
        break;
      case TOKT_SSTR_START:
      case TOKT_SSTR_MID:
      case TOKT_SSTR_END:
        break;
      default:
        if ((tVar3 == TOKT_EOF) || (tVar3 == TOKT_RPAR)) goto LAB_0021ff24;
      }
      next_on_line_xlat(this,p,tok,(tok_embed_ctx *)0x0);
    } while( true );
  }
LAB_0021fdc3:
  (this->linebuf_).buf_len_ = 0;
  if ((this->linebuf_).buf_size_ != 0) {
    *(this->linebuf_).buf_ = '\0';
  }
  (this->p_).p_ = (this->linebuf_).buf_;
  return;
LAB_0021ff24:
  CTcHostIfc::print_msg(G_hostifc,"%.*s",1,"\n");
  goto LAB_0021fdc3;
}

Assistant:

void CTcTokenizer::pragma_message()
{
    size_t startofs;

    /* 
     *   copy the source line through the "message" token to the macro
     *   expansion buffer - we don't want to expand that part, but we want
     *   it to appear in the expansion, so just copy the original 
     */
    startofs = (curtok_.get_text() + curtok_.get_text_len()
                - linebuf_.get_text());
    expbuf_.copy(linebuf_.get_text(), startofs);

    /* expand macros; don't allow reading additional lines */
    if (expand_macros_curline(FALSE, FALSE, TRUE))
    {
        clear_linebuf();
        return;
    }

    /* 
     *   If we're in normal compilation mode, display the message.  If we're
     *   in preprocess-only mode, simply retain the message in the
     *   preprocessed result, so that it shows up when the result is
     *   compiled.  
     *   
     *   Ignore messages in list-includes mode.  
     */
    if (!pp_only_mode_ && !list_includes_mode_)
    {
        /* set up at the first post-processed token */
        start_new_line(&expbuf_, startofs);

        /* if there's an open paren, skip it */
        if (next_on_line_xlat(0) == TOKT_LPAR)
            next_on_line_xlat(0);
        else
            log_warning(TCERR_BAD_PRAGMA_SYNTAX);

        /* keep going until we reach the closing paren */
        while (curtok_.gettyp() != TOKT_RPAR
               && curtok_.gettyp() != TOKT_EOF)
        {
            /* display this token */
            switch(curtok_.gettyp())
            {
            case TOKT_SSTR:
            case TOKT_DSTR:
            case TOKT_SYM:
                /* display the text of the token */
                msg_str(curtok_.get_text(), curtok_.get_text_len());
                break;

            case TOKT_INT:
                /* display the integer */
                msg_long(curtok_.get_int_val());
                break;

            default:
                /* ignore anything else */
                break;
            }

            /* get the next token */
            next_on_line_xlat(0);
        }

        /* end the line */
        msg_str("\n", 1);
        
        /* remove the message from the result text */
        clear_linebuf();
    }
    else
    {
        /* preprocessing - copy expanded text to line buffer */
        linebuf_.copy(expbuf_.get_text(), expbuf_.get_text_len());
    }
}